

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

void __thiscall uS::Socket::changePoll(Socket *this,SocketData *socketData)

{
  NodeData *pNVar1;
  pthread_t pVar2;
  pthread_t pVar3;
  
  pNVar1 = socketData->nodeData;
  pVar2 = pNVar1->tid;
  pVar3 = pthread_self();
  if (pVar2 == pVar3) {
    uv_poll_start(this->p,socketData->poll,this->p->poll_cb);
    return;
  }
  std::mutex::lock(pNVar1->asyncMutex);
  std::vector<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>::push_back
            (&socketData->nodeData->changePollQueue,&this->p);
  pthread_mutex_unlock((pthread_mutex_t *)socketData->nodeData->asyncMutex);
  uv_async_send(socketData->nodeData->async);
  return;
}

Assistant:

void changePoll(SocketData *socketData) {
        if (socketData->nodeData->tid != pthread_self()) {
            socketData->nodeData->asyncMutex->lock();
            socketData->nodeData->changePollQueue.push_back(p);
            socketData->nodeData->asyncMutex->unlock();
            uv_async_send(socketData->nodeData->async);
        } else {
            uv_poll_start(p, socketData->poll, getPollCallback());
        }
    }